

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

int within_camp_bounds(uint8_t area,mappos8_t *mappos)

{
  uint uVar1;
  undefined3 in_register_00000039;
  uint uVar2;
  
  uVar2 = CONCAT31(in_register_00000039,area);
  uVar1 = 0;
  if (((within_camp_bounds::permitted_bounds[uVar2].x0 <= mappos->u) &&
      (mappos->u < within_camp_bounds::permitted_bounds[uVar2].x1)) &&
     (within_camp_bounds::permitted_bounds[uVar2].y0 <= mappos->v)) {
    uVar1 = (uint)(mappos->v < within_camp_bounds::permitted_bounds[uVar2].y1);
  }
  return uVar1;
}

Assistant:

int within_camp_bounds(uint8_t          area, // ought to be an enum
                       const mappos8_t *mappos)
{
  /**
   * $9F15: Bounds of the three main exterior areas.
   */
  static const bounds_t permitted_bounds[3] =
  {
    { 86, 94, 61, 72 }, /* Corridor to yard */
    { 78,132, 71,116 }, /* Hut area */
    { 79,105, 47, 63 }, /* Yard area */
  };

  const bounds_t *bounds; /* was HL */

  assert(area < NELEMS(permitted_bounds));
  assert(mappos != NULL);

  bounds = &permitted_bounds[area];
  return mappos->u >= bounds->x0 && mappos->u < bounds->x1 &&
         mappos->v >= bounds->y0 && mappos->v < bounds->y1;
}